

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber_tlv_length.c
# Opt level: O2

ssize_t ber_skip_length(asn_codec_ctx_t *opt_codec_ctx,int _is_constructed,void *ptr,size_t size)

{
  ulong uVar1;
  ulong uVar2;
  ssize_t sVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  byte *ptr_00;
  ber_tlv_len_t vlen;
  ber_tlv_tag_t tag;
  
  if ((opt_codec_ctx != (asn_codec_ctx_t *)0x0) &&
     (sVar6 = opt_codec_ctx->max_stack_size, sVar6 != 0)) {
    lVar5 = (long)opt_codec_ctx - (long)&vlen;
    lVar4 = -lVar5;
    if (lVar5 < 1) {
      lVar4 = lVar5;
    }
    if (SBORROW8(lVar4,-sVar6) != (long)(lVar4 + sVar6) < 0) {
      return -1;
    }
  }
  uVar1 = ber_fetch_length(_is_constructed,ptr,size,&vlen);
  uVar2 = uVar1;
  if (0 < (long)uVar1) {
    if (vlen < 0) {
      ptr_00 = (byte *)((long)ptr + uVar1);
      sVar6 = size - uVar1;
      while (uVar2 = ber_fetch_tag(ptr_00,sVar6,&tag), 0 < (long)uVar2) {
        sVar3 = ber_skip_length(opt_codec_ctx,*ptr_00 >> 5 & 1,ptr_00 + uVar2,sVar6 - uVar2);
        if (sVar3 < 1) {
          return sVar3;
        }
        uVar1 = uVar1 + uVar2 + sVar3;
        if ((*ptr_00 == 0) && (ptr_00[1] == 0)) {
          return uVar1;
        }
        ptr_00 = ptr_00 + uVar2 + sVar3;
        sVar6 = sVar6 - (uVar2 + sVar3);
      }
    }
    else {
      uVar2 = 0;
      if (vlen + uVar1 <= size) {
        uVar2 = vlen + uVar1;
      }
    }
  }
  return uVar2;
}

Assistant:

ssize_t
ber_skip_length(asn_codec_ctx_t *opt_codec_ctx,
		int _is_constructed, const void *ptr, size_t size) {
	ber_tlv_len_t vlen;	/* Length of V in TLV */
	ssize_t tl;		/* Length of L in TLV */
	ssize_t ll;		/* Length of L in TLV */
	size_t skip;

	/*
	 * Make sure we didn't exceed the maximum stack size.
	 */
	if(ASN__STACK_OVERFLOW_CHECK(opt_codec_ctx))
		return -1;

	/*
	 * Determine the size of L in TLV.
	 */
	ll = ber_fetch_length(_is_constructed, ptr, size, &vlen);
	if(ll <= 0) return ll;

	/*
	 * Definite length.
	 */
	if(vlen >= 0) {
		skip = ll + vlen;
		if(skip > size)
			return 0;	/* Want more */
		return skip;
	}

	/*
	 * Indefinite length!
	 */
	ASN_DEBUG("Skipping indefinite length");
	for(skip = ll, ptr = ((const char *)ptr) + ll, size -= ll;;) {
		ber_tlv_tag_t tag;

		/* Fetch the tag */
		tl = ber_fetch_tag(ptr, size, &tag);
		if(tl <= 0) return tl;

		ll = ber_skip_length(opt_codec_ctx,
			BER_TLV_CONSTRUCTED(ptr),
			((const char *)ptr) + tl, size - tl);
		if(ll <= 0) return ll;

		skip += tl + ll;

		/*
		 * This may be the end of the indefinite length structure,
		 * two consecutive 0 octets.
		 * Check if it is true.
		 */
		if(((const uint8_t *)ptr)[0] == 0
		&& ((const uint8_t *)ptr)[1] == 0)
			return skip;

		ptr = ((const char *)ptr) + tl + ll;
		size -= tl + ll;
 	}

	/* UNREACHABLE */
}